

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::spacechar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  size_t sVar1;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> *poVar2;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  undefined1 local_38 [8];
  LexCtx ctx;
  
  ctx.input._M_str = (char *)0x0;
  sv._M_str = " ";
  sv._M_len = 1;
  local_38 = (undefined1  [8])this;
  ctx.input._M_len = in._M_len;
  sVar1 = LexCtx::startsWith((LexCtx *)local_38,sv);
  if (sVar1 == 0) {
    sv_00._M_str = "\n";
    sv_00._M_len = 1;
    sVar1 = LexCtx::startsWith((LexCtx *)local_38,sv_00);
    if (sVar1 == 0) {
      sv_01._M_str = "\r";
      sv_01._M_len = 1;
      sVar1 = LexCtx::startsWith((LexCtx *)local_38,sv_01);
      if (sVar1 == 0) {
        sv_02._M_str = "\t";
        sv_02._M_len = 1;
        sVar1 = LexCtx::startsWith((LexCtx *)local_38,sv_02);
        if (sVar1 == 0) {
          poVar2 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)0x0;
          goto LAB_009e4c81;
        }
      }
    }
  }
  *(ulong *)&(__return_storage_ptr__->
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>).
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload = (ulong)(this != (anon_unknown_10 *)0x0);
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
  _M_value.span._M_str = (char *)in._M_len;
  poVar2 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)&DAT_00000001;
LAB_009e4c81:
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged =
       SUB81(poVar2,0);
  return poVar2;
}

Assistant:

std::optional<LexResult> spacechar(std::string_view in) {
  LexCtx ctx(in);
  ctx.takePrefix(" "sv) || ctx.takePrefix("\n"sv) || ctx.takePrefix("\r"sv) ||
    ctx.takePrefix("\t"sv);
  return ctx.lexed();
}